

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SEnumVal.cpp
# Opt level: O2

void processDatatypeValidator(DatatypeValidator *dtValidator,bool margin)

{
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *toEnum;
  wchar16 *toInsert;
  int iVar1;
  KVStringPair *pKVar2;
  char16_t *pcVar3;
  ostream *poVar4;
  BaseRefVectorOf<char16_t> *this;
  XMLSize_t XVar5;
  XMLSize_t XVar6;
  RefVectorOf<char16_t> sortedList;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> enumFacets;
  StrX local_a8;
  StrX local_a0;
  RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *local_98;
  BaseRefVectorOf<char16_t> local_90;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> local_60;
  
  if (dtValidator != (DatatypeValidator *)0x0) {
    if (margin) {
      std::operator<<((ostream *)&std::cout,"\t");
    }
    std::operator<<((ostream *)&std::cout,"Base Datatype:\t\t");
    if ((ulong)*(uint *)(dtValidator + 0x1c) < 0x1c) {
      std::operator<<((ostream *)&std::cout,
                      &DAT_00107934 +
                      *(int *)(&DAT_00107934 + (ulong)*(uint *)(dtValidator + 0x1c) * 4));
    }
    std::operator<<((ostream *)&std::cout,"\n");
    toEnum = *(RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> **)
              (dtValidator + 0x30);
    if ((toEnum != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) &&
       (*(long *)(toEnum + 0x28) != 0)) {
      std::operator<<((ostream *)&std::cout,"Facets:\t\t\n");
      xercesc_4_0::RefVectorOf<char16_t>::RefVectorOf
                ((RefVectorOf<char16_t> *)&local_90,*(XMLSize_t *)(toEnum + 0x28),false,
                 xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_98 = toEnum;
      xercesc_4_0::RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
      RefHashTableOfEnumerator
                (&local_60,toEnum,false,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
LAB_00105bd3:
      if ((local_60.fCurElem != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) ||
         (local_60.fCurHash != *(XMLSize_t *)(local_60.fToEnum + 0x18))) {
        pKVar2 = xercesc_4_0::
                 RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
                 nextElement(&local_60);
        XVar5 = local_90.fCurCount;
        toInsert = *(wchar16 **)(pKVar2 + 0x18);
        for (XVar6 = 0; XVar5 != XVar6; XVar6 = XVar6 + 1) {
          pcVar3 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(&local_90,XVar6);
          iVar1 = xercesc_4_0::XMLString::compareString(toInsert,pcVar3);
          if (iVar1 < 0) {
            xercesc_4_0::BaseRefVectorOf<char16_t>::insertElementAt(&local_90,toInsert,XVar6);
            if (XVar5 != XVar6) goto LAB_00105bd3;
            break;
          }
        }
        xercesc_4_0::BaseRefVectorOf<char16_t>::addElement(&local_90,toInsert);
        goto LAB_00105bd3;
      }
      for (XVar5 = 0; local_90.fCurCount != XVar5; XVar5 = XVar5 + 1) {
        pcVar3 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(&local_90,XVar5);
        poVar4 = std::operator<<((ostream *)&std::cout,"\t");
        StrX::StrX(&local_a0,pcVar3);
        std::operator<<(poVar4,local_a0.fLocalForm);
        poVar4 = std::operator<<(poVar4,"=");
        pKVar2 = xercesc_4_0::RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
                 get(local_98,pcVar3);
        StrX::StrX(&local_a8,*(XMLCh **)(pKVar2 + 0x20));
        std::operator<<(poVar4,local_a8.fLocalForm);
        std::operator<<(poVar4,"\n");
        StrX::~StrX(&local_a8);
        StrX::~StrX(&local_a0);
      }
      xercesc_4_0::RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
      ~RefHashTableOfEnumerator(&local_60);
      xercesc_4_0::RefVectorOf<char16_t>::~RefVectorOf((RefVectorOf<char16_t> *)&local_90);
    }
    this = (BaseRefVectorOf<char16_t> *)(**(code **)(*(long *)dtValidator + 0x30))();
    if (this != (BaseRefVectorOf<char16_t> *)0x0) {
      std::operator<<((ostream *)&std::cout,"Enumeration:\t\t\n");
      XVar5 = this->fCurCount;
      for (XVar6 = 0; XVar5 != XVar6; XVar6 = XVar6 + 1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"\t");
        pcVar3 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt(this,XVar6);
        StrX::StrX((StrX *)&local_90,pcVar3);
        std::operator<<(poVar4,(char *)local_90._vptr_BaseRefVectorOf);
        std::operator<<(poVar4,"\n");
        StrX::~StrX((StrX *)&local_90);
      }
    }
  }
  return;
}

Assistant:

void processDatatypeValidator( const DatatypeValidator* dtValidator, bool margin )
{
    if( !dtValidator )
    {
        return;
    }

    if( margin )
    {
        std::cout << "\t";
    }

    std::cout << "Base Datatype:\t\t";
    switch( dtValidator->getType() )
    {
    case DatatypeValidator::String:         std::cout << "string";      break;
    case DatatypeValidator::AnyURI:         std::cout << "AnyURI";      break;
    case DatatypeValidator::QName:          std::cout << "QName";       break;
    case DatatypeValidator::Name:           std::cout << "Name";        break;
    case DatatypeValidator::NCName:         std::cout << "NCName";      break;
    case DatatypeValidator::Boolean:        std::cout << "Boolean";     break;
    case DatatypeValidator::Float:          std::cout << "Float";       break;
    case DatatypeValidator::Double:         std::cout << "Double";      break;
    case DatatypeValidator::Decimal:        std::cout << "Decimal";     break;
    case DatatypeValidator::HexBinary:      std::cout << "HexBinary";   break;
    case DatatypeValidator::Base64Binary:   std::cout << "Base64Binary";break;
    case DatatypeValidator::Duration:       std::cout << "Duration";    break;
    case DatatypeValidator::DateTime:       std::cout << "DateTime";    break;
    case DatatypeValidator::Date:           std::cout << "Date";        break;
    case DatatypeValidator::Time:           std::cout << "Time";        break;
    case DatatypeValidator::MonthDay:       std::cout << "MonthDay";    break;
    case DatatypeValidator::YearMonth:      std::cout << "YearMonth";   break;
    case DatatypeValidator::Year:           std::cout << "Year";        break;
    case DatatypeValidator::Month:          std::cout << "Month";       break;
    case DatatypeValidator::Day:            std::cout << "Day";         break;
    case DatatypeValidator::ID:             std::cout << "ID";          break;
    case DatatypeValidator::IDREF:          std::cout << "IDREF";       break;
    case DatatypeValidator::ENTITY:         std::cout << "ENTITY";      break;
    case DatatypeValidator::NOTATION:       std::cout << "NOTATION";    break;
    case DatatypeValidator::List:           std::cout << "List";        break;
    case DatatypeValidator::Union:          std::cout << "Union";       break;
    case DatatypeValidator::AnySimpleType:  std::cout << "AnySimpleType"; break;
    case DatatypeValidator::UnKnown:        std::cout << "UNKNOWN";     break;
    }

    std::cout << "\n";

    // Facets
	RefHashTableOf<KVStringPair>* facets = dtValidator->getFacets();
    if( facets && facets->getCount()>0)
    {
        XMLSize_t i;
        // Element's properties
        std::cout << "Facets:\t\t\n";
        // use a list to print them sorted, or the list could be different on 64-bit machines
        RefVectorOf<XMLCh> sortedList(facets->getCount(), false);
        RefHashTableOfEnumerator<KVStringPair> enumFacets(facets);
        while( enumFacets.hasMoreElements() )
        {
            const KVStringPair& curPair = enumFacets.nextElement();
            const XMLCh* key=curPair.getKey();
            XMLSize_t len=sortedList.size();
            for(i=0;i<len;i++)
                if(XMLString::compareString(key, sortedList.elementAt(i))<0)
                {
                    sortedList.insertElementAt((XMLCh*)key,i);
                    break;
                }
            if(i==len)
                sortedList.addElement((XMLCh*)key);
        }

        XMLSize_t len=sortedList.size();
        for(i=0;i<len;i++)
        {
            const XMLCh* key = sortedList.elementAt(i);
            std::cout << "\t" << StrX( key )    << "="
                         << StrX( facets->get(key)->getValue() )  << "\n";
        }
    }

	// Enumerations
	RefVectorOf<XMLCh>* enums = (RefVectorOf<XMLCh>*) dtValidator->getEnumString();
	if (enums)
	{
		std::cout << "Enumeration:\t\t\n";

		XMLSize_t enumLength = enums->size();
		for ( XMLSize_t i = 0; i < enumLength; i++)
        {
            std::cout << "\t" << StrX( enums->elementAt(i)) << "\n";
        }

	}
}